

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogf_tools.cxx
# Opt level: O0

void __thiscall omf_tools::process(omf_tools *this,cl_parser *cl)

{
  bool bVar1;
  target_format tVar2;
  uint uVar3;
  size_t sVar4;
  char *source_00;
  xr_ogf_v4 *this_00;
  xr_ogf_v4 *omf;
  char *source;
  size_t num_params;
  size_t i;
  target_format format;
  cl_parser *cl_local;
  omf_tools *this_local;
  
  tVar2 = object_tools::get_target_format((object_tools *)this,cl);
  if (((tVar2 == TARGET_DEFAULT) || (tVar2 == TARGET_SKL)) || (tVar2 == TARGET_SKLS)) {
    bVar1 = batch_helper::prepare_target_name
                      (&(this->super_ogf_tools).super_object_tools.super_batch_helper,cl);
    if (bVar1) {
      num_params = 0;
      sVar4 = cl_parser::num_params(cl);
      for (; num_params != sVar4; num_params = num_params + 1) {
        source_00 = cl_parser::param(cl,num_params);
        this_00 = (xr_ogf_v4 *)operator_new(0x7b8);
        xray_re::xr_ogf_v4::xr_ogf_v4(this_00);
        uVar3 = (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory.
                  _vptr_xr_surface_factory[0x21])(this_00,source_00);
        if ((uVar3 & 1) == 0) {
          xray_re::msg("can\'t load %s",source_00);
        }
        else if (tVar2 == TARGET_DEFAULT) {
LAB_0019cc5d:
          object_tools::save_skls((object_tools *)this,(xr_object *)this_00,source_00);
        }
        else if (tVar2 == TARGET_SKL) {
          object_tools::save_skl((object_tools *)this,(xr_object *)this_00,source_00,cl);
        }
        else if (tVar2 == TARGET_SKLS) goto LAB_0019cc5d;
        if (this_00 != (xr_ogf_v4 *)0x0) {
          (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory.
            _vptr_xr_surface_factory[1])();
        }
      }
    }
  }
  else {
    xray_re::msg("unsupported options combination");
  }
  return;
}

Assistant:

void omf_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_DEFAULT:
	case TARGET_SKLS:
	case TARGET_SKL:
		break;
	default:
		msg("unsupported options combination");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_ogf_v4* omf = new xr_ogf_v4;
		if (omf->load_omf(source)) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_SKLS:
				save_skls(*omf, source);
				break;
			case TARGET_SKL:
				save_skl(*omf, source, cl);
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete omf;
	}
}